

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr10r1100sixx.cpp
# Opt level: O1

bool __thiscall
IKSolver::ComputeIk(IKSolver *this,IkReal *eetrans,IkReal *eerot,IkReal *pfree,
                   IkSolutionListBase<double> *solutions)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  bool bVar5;
  int ij2;
  long lVar6;
  long lVar7;
  bool bVar8;
  ulong uVar9;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  uint uVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  bool j2valid [2];
  bool j0valid [2];
  IkReal j2array [2];
  IkReal j0array [2];
  IkReal sj2array [2];
  IkReal cj2array [2];
  IkReal sj0array [2];
  IkReal cj0array [2];
  ushort local_18c;
  ushort local_18a;
  undefined1 local_188 [16];
  double local_178;
  double local_170;
  double local_168;
  undefined8 uStack_160;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  undefined8 uStack_120;
  double local_118;
  undefined8 uStack_110;
  double local_108;
  undefined8 uStack_100;
  double local_f8 [6];
  double local_c8 [4];
  double local_a8 [7];
  undefined8 uStack_70;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  
  this->j0 = NAN;
  this->_ij0[0] = 0xff;
  this->_ij0[1] = 0xff;
  this->_nj0 = 0xff;
  this->j1 = NAN;
  this->_ij1[0] = 0xff;
  this->_ij1[1] = 0xff;
  this->_nj1 = 0xff;
  this->j2 = NAN;
  this->_ij2[0] = 0xff;
  this->_ij2[1] = 0xff;
  this->_nj2 = 0xff;
  this->j3 = NAN;
  this->_ij3[0] = 0xff;
  this->_ij3[1] = 0xff;
  this->_nj3 = 0xff;
  this->j4 = NAN;
  this->_ij4[0] = 0xff;
  this->_ij4[1] = 0xff;
  this->_nj4 = 0xff;
  this->j5 = NAN;
  this->_ij5[0] = 0xff;
  this->_ij5[1] = 0xff;
  this->_nj5 = 0xff;
  (*solutions->_vptr_IkSolutionListBase[5])(solutions);
  dVar16 = *eerot;
  this->r00 = dVar16;
  dVar12 = eerot[1];
  this->r01 = dVar12;
  dVar28 = eerot[2];
  this->r02 = dVar28;
  dVar11 = eerot[3];
  this->r10 = dVar11;
  dVar18 = eerot[4];
  this->r11 = dVar18;
  dVar22 = eerot[5];
  this->r12 = dVar22;
  dVar24 = eerot[6];
  this->r20 = dVar24;
  dVar14 = eerot[7];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar14;
  this->r21 = dVar14;
  dVar15 = eerot[8];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar15;
  this->r22 = dVar15;
  dVar13 = *eetrans;
  this->px = dVar13;
  dVar19 = eetrans[1];
  this->py = dVar19;
  dVar21 = eetrans[2];
  this->new_r00 = dVar28;
  this->new_r01 = dVar12;
  this->new_r02 = -dVar16;
  this->r02 = -dVar16;
  dVar13 = dVar16 * -0.08 + dVar13;
  this->new_px = dVar13;
  auVar1._8_4_ = SUB84(dVar22,0);
  auVar1._0_8_ = -dVar22;
  auVar1._12_4_ = (uint)((ulong)dVar22 >> 0x20) ^ 0x80000000;
  this->new_r10 = -dVar22;
  this->r10 = (IkReal)auVar1._8_8_;
  auVar2._8_4_ = SUB84(dVar18,0);
  auVar2._0_8_ = -dVar18;
  auVar2._12_4_ = (uint)((ulong)dVar18 >> 0x20) ^ 0x80000000;
  this->new_r11 = -dVar18;
  this->r11 = (IkReal)auVar2._8_8_;
  this->new_r12 = dVar11;
  dVar19 = dVar11 * 0.08 - dVar19;
  this->new_py = dVar19;
  auVar1 = _DAT_00134070;
  auVar23 = auVar23 ^ _DAT_00134070;
  auVar26._0_8_ = auVar23._0_8_;
  auVar26._8_4_ = auVar23._0_4_;
  auVar26._12_4_ = auVar23._4_4_;
  this->new_r20 = auVar26._0_8_;
  this->r20 = (IkReal)auVar26._8_8_;
  auVar20 = auVar20 ^ auVar1;
  auVar29._0_8_ = auVar20._0_8_;
  auVar29._8_4_ = auVar20._0_4_;
  auVar29._12_4_ = auVar20._4_4_;
  this->new_r21 = auVar29._0_8_;
  this->r21 = (IkReal)auVar29._8_8_;
  dVar21 = dVar24 * 0.08 + (0.4 - dVar21);
  this->new_r22 = dVar24;
  this->new_pz = dVar21;
  this->r00 = dVar28;
  this->r01 = dVar12;
  this->r12 = dVar11;
  this->r22 = dVar24;
  this->px = dVar13;
  this->py = dVar19;
  this->pz = dVar21;
  this->pp = dVar21 * dVar21 + dVar13 * dVar13 + dVar19 * dVar19;
  this->npx = (dVar13 * dVar28 - dVar19 * dVar22) - dVar21 * dVar15;
  this->npy = (dVar13 * dVar12 - dVar19 * dVar18) - dVar21 * dVar14;
  this->npz = dVar21 * dVar24 + (dVar11 * dVar19 - dVar13 * dVar16);
  this->rxp0_0 = dVar15 * dVar19 - dVar21 * dVar22;
  this->rxp0_1 = auVar26._0_8_ * dVar13 - dVar21 * dVar28;
  this->rxp0_2 = dVar22 * dVar13 + dVar28 * dVar19;
  this->rxp1_0 = dVar14 * dVar19 - dVar21 * dVar18;
  this->rxp1_1 = auVar29._0_8_ * dVar13 - dVar21 * dVar12;
  this->rxp1_2 = dVar18 * dVar13 + dVar12 * dVar19;
  this->rxp2_0 = dVar21 * dVar11 - dVar19 * dVar24;
  this->rxp2_1 = dVar24 * dVar13 + dVar16 * dVar21;
  this->rxp2_2 = -dVar11 * dVar13 - dVar19 * dVar16;
  if (ABS(ABS(dVar13) + ABS(dVar19)) < 1e-06) goto LAB_0011711c;
  local_18a = 0;
  this->_nj0 = '\x02';
  dVar16 = 0.0;
  uVar10 = 0;
  uVar17 = 0;
  if ((NAN(dVar19) || NAN(-dVar13)) || ((ABS(dVar13) <= 1e-07 && (ABS(dVar19) < 1e-07)))) {
    bVar5 = false;
  }
  else {
    dVar16 = atan2(dVar19,-dVar13);
    bVar5 = true;
    uVar10 = extraout_XMM0_Dc;
    uVar17 = extraout_XMM0_Dd;
  }
  if (!bVar5) goto LAB_0011711c;
  local_f8[2] = -dVar16;
  local_188._8_4_ = uVar10;
  local_188._0_8_ = local_f8[2];
  local_188._12_4_ = uVar17 ^ 0x80000000;
  local_a8[0] = sin(local_f8[2]);
  local_a8[2] = cos((double)local_188._0_8_);
  local_f8[3] = 3.14159265358979 - dVar16;
  local_188._0_8_ = local_f8[3];
  local_a8[1] = sin(local_f8[3]);
  local_a8[3] = cos((double)local_188._0_8_);
  if (-3.14159265358979 <= dVar16) {
    if (3.14159265358979 < dVar16) {
      uVar10 = 0x401921fb;
      goto LAB_00115551;
    }
  }
  else {
    uVar10 = 0xc01921fb;
LAB_00115551:
    local_f8[2] = (double)CONCAT44(uVar10,0x54442d1c) - dVar16;
  }
  if ((double)local_188._0_8_ <= 3.14159265358979) {
    if ((double)local_188._0_8_ < -3.14159265358979) {
      uVar10 = 0x401921fb;
      goto LAB_0011559c;
    }
  }
  else {
    uVar10 = 0xc01921fb;
LAB_0011559c:
    local_f8[3] = (double)local_188._0_8_ + (double)CONCAT44(uVar10,0x54442d1c);
  }
  local_18a = 0x101;
  bVar5 = true;
  lVar7 = 0;
  do {
    if (local_188[lVar7 + -2] == '\x01') {
      this->_ij0[0] = (uchar)lVar7;
      this->_ij0[1] = 0xff;
      if ((((lVar7 == 0) && (bVar5)) && (ABS(local_a8[2] - local_a8[3]) < 1e-06)) &&
         (ABS(local_a8[0] - local_a8[1]) < 1e-06)) {
        local_18a = local_18a & 0xff;
        this->_ij0[1] = '\x01';
        bVar5 = false;
      }
      this->j0 = local_f8[lVar7 + 2];
      dVar16 = local_c8[lVar7 + 6];
      this->cj0 = dVar16;
      dVar12 = local_c8[lVar7 + 4];
      this->sj0 = dVar12;
      local_18c = 0;
      this->_nj2 = '\x02';
      dVar16 = dVar16 * 0.0864856630609769 * this->px +
               this->py * 0.0864856630609769 * dVar12 +
               this->pp * -1.72971326121954 + 1.00223910638213;
      if (ABS(dVar16) <= 1.0000001) {
        dVar16 = IKasin(dVar16);
        local_f8[0] = -1.50293950393859 - dVar16;
        local_188._0_8_ = local_f8[0];
        local_c8[0] = sin(local_f8[0]);
        local_c8[2] = cos((double)local_188._0_8_);
        dVar16 = dVar16 + 1.6386531496512;
        local_f8[1] = dVar16;
        local_c8[1] = sin(dVar16);
        local_c8[3] = cos(dVar16);
        if ((double)local_188._0_8_ <= 3.14159265358979) {
          if ((double)local_188._0_8_ < -3.14159265358979) {
            local_f8[0] = (double)local_188._0_8_ + 6.28318530717959;
            goto LAB_00115798;
          }
        }
        else {
          local_f8[0] = (double)local_188._0_8_ + -6.28318530717959;
LAB_00115798:
        }
        uVar10 = 0xc01921fb;
        if ((3.14159265358979 < dVar16) || (uVar10 = 0x401921fb, dVar16 < -3.14159265358979)) {
          local_f8[1] = dVar16 + (double)CONCAT44(uVar10,0x54442d1c);
        }
        local_18c = 0x101;
        local_58 = local_c8[3];
        bVar8 = true;
        local_60 = local_c8[1];
        lVar6 = 0;
        do {
          if (*(char *)((long)&local_18c + lVar6) == '\x01') {
            this->_ij2[0] = (uchar)lVar6;
            this->_ij2[1] = 0xff;
            if (((lVar6 == 0) && (bVar8)) &&
               ((ABS(local_c8[2] - local_58) < 1e-06 && (ABS(local_c8[0] - local_60) < 1e-06)))) {
              local_18c = local_18c & 0xff;
              this->_ij2[1] = '\x01';
              bVar8 = false;
            }
            this->j2 = local_f8[lVar6];
            dVar16 = local_c8[lVar6 + 2];
            this->cj2 = dVar16;
            dVar12 = local_c8[lVar6];
            this->sj2 = dVar12;
            local_118 = dVar16 * dVar16;
            local_138 = this->cj0;
            local_148 = this->px;
            dVar24 = local_138 * local_148;
            local_128 = dVar16 * dVar12;
            local_140 = this->py;
            dVar18 = this->sj0 * local_140;
            local_a8[4] = this->pz;
            local_108 = local_a8[4] * local_a8[4];
            uStack_100 = 0;
            local_168 = local_118 * 0.264;
            uStack_160 = 0;
            local_178 = local_128 * 0.264;
            local_50 = dVar12 * 0.515;
            dVar11 = dVar16 * 0.035;
            local_170 = dVar11;
            dVar28 = dVar16 * local_a8[4];
            dVar22 = dVar12 * local_a8[4];
            local_188._0_8_ = -dVar24;
            local_188._8_8_ = 0x8000000000000000;
            local_a8[5] = 0.0;
            local_a8[6] = dVar24 * local_50;
            uStack_70 = 0;
            local_130 = local_50 * dVar18;
            if (((ABS(ABS(local_a8[4] * -0.025 +
                          dVar16 * -0.0196 + local_118 * -0.03605 + dVar12 * 0.2884 + 0.018025 +
                          local_178 + local_a8[4] * dVar18 + local_a8[4] * dVar24) +
                      ABS(local_128 * 0.03605 + local_108 + -0.265225 + local_168)) < 1e-06) ||
                (ABS(dVar22 * 40.0 +
                     dVar12 * 588.571428571429 * dVar18 +
                     ((dVar28 * 588.571428571429 +
                      dVar12 * -14.7142857142857 +
                      dVar24 * dVar12 * 588.571428571429 +
                      (local_a8[4] * 640.0 - dVar24 * dVar16 * 40.0) + dVar16) -
                     dVar16 * 40.0 * dVar18)) < 1e-06)) ||
               (dVar16 * 0.000875 +
                ((dVar28 * 0.515 +
                  dVar22 * 0.035 + dVar12 * -0.012875 + (local_a8[4] * 0.56 - dVar24 * dVar11) +
                 local_a8[6]) - dVar18 * dVar11) + local_130 == 0.0)) {
              local_48 = -dVar18;
              local_f8[5] = dVar12 * 0.035;
              dVar19 = dVar16 * 0.515;
              local_178 = local_48 * dVar19;
              uStack_40 = 0x8000000000000000;
              dVar15 = local_48 * local_f8[5];
              local_168 = dVar24;
              uStack_160 = 0;
              dVar14 = dVar24 * -0.56;
              dVar13 = dVar18 * -0.56;
              dVar21 = (double)local_188._0_8_ * dVar19;
              if ((ABS(dVar16 * 588.571428571429 * (double)local_188._0_8_ +
                       dVar22 * 588.571428571429 +
                       dVar24 * -640.0 +
                       dVar18 * -640.0 +
                       ((dVar28 * -40.0 +
                        dVar16 * 14.7142857142857 +
                        local_48 * dVar12 * 40.0 +
                        local_48 * dVar16 * 588.571428571429 + dVar12 + 16.0) -
                       dVar12 * 40.0 * dVar24)) < 1e-06) ||
                 (dVar12 * 0.000875 +
                  dVar28 * -0.035 +
                  dVar16 * 0.012875 + dVar22 * 0.515 + 0.014 + local_178 + dVar15 + dVar14 + dVar13
                  + (double)local_188._0_8_ * local_f8[5] + dVar21 == 0.0)) {
                local_150 = dVar15;
                local_128 = dVar13;
                uStack_120 = 0;
                local_118 = dVar14;
                uStack_110 = 0;
                dVar22 = local_138 * local_138;
                dVar28 = local_140 * local_140;
                dVar25 = local_148 * local_148 * dVar22;
                if (1e-06 <= ABS((local_108 * -1600.0 +
                                 dVar25 * -1600.0 +
                                 dVar24 * 80.0 +
                                 dVar18 * 80.0 +
                                 dVar24 * -3200.0 * dVar18 + dVar22 * dVar28 * 1600.0 + -1.0) -
                                 dVar28 * 1600.0)) {
                  dVar27 = dVar24 * 0.05;
                  dVar24 = dVar24 * -2.0 * dVar18;
                  if ((((dVar18 * 0.05 + -0.000625 + dVar27 + dVar24 + dVar22 * dVar28) - local_108)
                      - dVar25) - dVar28 != 0.0) {
                    local_148 = dVar22 * dVar28;
                    local_108 = dVar18 * 0.05;
                    uStack_100 = 0;
                    dVar18 = dVar16 * 0.000875 +
                             (double)local_188._0_8_ * dVar11 +
                             local_a8[6] +
                             local_48 * dVar11 +
                             local_a8[4] * -0.56 +
                             local_130 +
                             dVar12 * -0.012875 +
                             (-local_a8[4] * local_f8[5] - dVar19 * local_a8[4]);
                    dVar16 = (dVar14 + dVar13 + dVar21 + (double)local_188._0_8_ * local_f8[5] +
                                                         dVar12 * 0.000875 +
                                                         dVar11 * local_a8[4] +
                                                         dVar16 * 0.012875 +
                                                         dVar15 + local_178 + 0.014) -
                             local_50 * local_a8[4];
                    this->_nj1 = '\x01';
                    if (NAN(dVar18) || NAN(dVar16)) {
                      bVar3 = false;
                      dVar16 = -1.5707963267949;
                    }
                    else if ((1e-07 <= ABS(dVar18)) || (1e-07 < ABS(dVar16))) {
                      uStack_160 = 0;
                      local_168 = dVar27;
                      local_140 = dVar28;
                      local_138 = dVar22;
                      dVar16 = atan2(dVar18,dVar16);
                      dVar16 = dVar16 + -1.5707963267949;
                      bVar3 = true;
                      dVar27 = local_168;
                      dVar28 = local_140;
                      dVar22 = local_138;
                    }
                    else {
                      bVar3 = false;
                      dVar16 = -1.5707963267949;
                    }
                    if (bVar3) {
                      dVar12 = (((dVar24 + local_148 + local_108 + dVar27 + -0.000625) - dVar28) -
                               this->pz * this->pz) - dVar22 * this->px * this->px;
                      uVar9 = -(ulong)(0.0 < dVar12);
                      dVar12 = (double)(uVar9 & 0x3ff0000000000000 |
                                       ~uVar9 & -(ulong)(dVar12 < 0.0) & 0xbff0000000000000);
                      if ((dVar12 != 0.0) || (NAN(dVar12))) {
                        dVar16 = (1.0 / dVar12) * 1.5707963267949 + dVar16;
                        dVar12 = sin(dVar16);
                        local_188._0_8_ = dVar12;
                        dVar12 = cos(dVar16);
                        if (dVar16 <= 3.14159265358979) {
                          if (dVar16 < -3.14159265358979) {
                            dVar16 = dVar16 + 6.28318530717959;
                          }
                        }
                        else {
                          dVar16 = dVar16 + -6.28318530717959;
                        }
                        this->_ij1[0] = '\0';
                        this->_ij1[1] = 0xff;
                        this->j1 = dVar16;
                        this->cj1 = dVar12;
                        this->sj1 = (IkReal)local_188._0_8_;
                        dVar28 = sin(dVar16);
                        dVar11 = cos(this->j1);
                        dVar12 = this->cj0 * this->px;
                        dVar22 = this->py * this->sj0;
                        dVar24 = this->sj2 * 0.515;
                        dVar16 = this->pz;
                        dVar18 = this->cj2 * 0.035;
                        if (ABS((dVar28 * -0.025 +
                                ((dVar12 * dVar28 + dVar28 * dVar22) - dVar18) + dVar24) -
                                dVar16 * dVar11) <= 1e-05) {
                          dVar14 = this->cj2 * 0.515;
                          dVar15 = this->sj2 * 0.035;
                          if (((ABS(-dVar16 * dVar28 +
                                    ((dVar11 * 0.025 + (0.56 - dVar12 * dVar11) + dVar15 + dVar14) -
                                    dVar22 * dVar11)) <= 1e-05) &&
                              (ABS(dVar28 * 0.56 +
                                   ((dVar28 * dVar14 +
                                    ((dVar15 * dVar28 + dVar11 * dVar24) - dVar16)) -
                                   dVar18 * dVar11)) <= 1e-05)) &&
                             (ABS(dVar11 * 1.12 * dVar12 +
                                  dVar12 * 0.05 +
                                  dVar22 * 0.05 +
                                  dVar16 * 1.12 * dVar28 +
                                  dVar11 * -0.028 +
                                  ((dVar22 * dVar11 * 1.12 + -0.047775) - this->pp)) <= 1e-05)) {
                            dVar12 = ((dVar18 * dVar28 +
                                      dVar14 * dVar11 +
                                      ((dVar11 * 0.56 + dVar15 * dVar11 + 0.025) - dVar24 * dVar28))
                                     - dVar22) - dVar12;
                            goto joined_r0x0011702e;
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
                local_170 = dVar21;
                dVar28 = dVar16 * -0.0196 +
                         local_128 * 0.264 +
                         local_118 * -0.03605 +
                         dVar12 * 0.2884 +
                         local_a8[4] * 0.025 + local_48 * local_a8[4] + 0.018025 +
                         (double)local_188._0_8_ * local_a8[4];
                dVar16 = dVar12 * -0.0392 +
                         dVar16 * -0.5768 +
                         local_108 + local_118 * -0.264 + local_128 * -0.03605 + -0.314825;
                this->_nj1 = '\x01';
                if (NAN(dVar28) || NAN(dVar16)) {
                  bVar3 = false;
                  dVar16 = -1.5707963267949;
                }
                else if ((1e-07 < ABS(dVar16)) || (1e-07 <= ABS(dVar28))) {
                  uStack_110 = 0;
                  uStack_120 = 0;
                  local_150 = dVar15;
                  local_128 = dVar13;
                  local_118 = dVar14;
                  dVar16 = atan2(dVar28,dVar16);
                  dVar16 = dVar16 + -1.5707963267949;
                  bVar3 = true;
                  dVar14 = local_118;
                  dVar15 = local_150;
                  dVar13 = local_128;
                }
                else {
                  bVar3 = false;
                  dVar16 = -1.5707963267949;
                }
                if (bVar3) {
                  dVar13 = dVar13 + dVar14 + this->sj2 * 0.000875 +
                                             ((this->cj2 * 0.012875 +
                                              this->pz * 0.515 * this->sj2 +
                                              this->cj2 * -0.035 * this->pz +
                                              local_170 + dVar15 + local_178 + 0.014) -
                                             local_f8[5] * local_168);
                  uVar9 = -(ulong)(0.0 < dVar13);
                  dVar12 = (double)(uVar9 & 0x3ff0000000000000 |
                                   ~uVar9 & -(ulong)(dVar13 < 0.0) & 0xbff0000000000000);
                  if ((dVar12 != 0.0) || (NAN(dVar12))) {
                    dVar16 = (1.0 / dVar12) * 1.5707963267949 + dVar16;
                    dVar12 = sin(dVar16);
                    local_188._0_8_ = dVar12;
                    dVar12 = cos(dVar16);
                    if (dVar16 <= 3.14159265358979) {
                      if (dVar16 < -3.14159265358979) {
                        dVar16 = dVar16 + 6.28318530717959;
                      }
                    }
                    else {
                      dVar16 = dVar16 + -6.28318530717959;
                    }
                    this->_ij1[0] = '\0';
                    this->_ij1[1] = 0xff;
                    this->j1 = dVar16;
                    this->cj1 = dVar12;
                    this->sj1 = (IkReal)local_188._0_8_;
                    dVar12 = sin(dVar16);
                    dVar28 = cos(this->j1);
                    dVar11 = this->cj0 * this->px;
                    dVar18 = this->py * this->sj0;
                    dVar22 = this->sj2 * 0.515;
                    dVar16 = this->pz;
                    dVar24 = this->cj2 * 0.035;
                    if (ABS(dVar12 * -0.025 +
                            (((dVar12 * dVar18 + dVar12 * dVar11) - dVar24) - dVar28 * dVar16) +
                            dVar22) <= 1e-05) {
                      dVar14 = this->sj2 * 0.035;
                      dVar15 = this->cj2 * 0.515;
                      if (((ABS((((dVar28 * 0.025 + (0.56 - dVar11 * dVar28)) - dVar18 * dVar28) +
                                 dVar14 + dVar15) - dVar12 * dVar16) <= 1e-05) &&
                          (ABS(dVar28 * dVar22 +
                               -dVar28 * dVar24 +
                               ((dVar12 * dVar15 + dVar12 * 0.56 + dVar12 * dVar14) - dVar16)) <=
                           1e-05)) &&
                         (ABS(dVar28 * 1.12 * dVar11 +
                              ((dVar18 * dVar28 * 1.12 +
                               dVar16 * 1.12 * dVar12 +
                               dVar28 * -0.028 + dVar11 * 0.05 + dVar18 * 0.05 + -0.047775) -
                              this->pp)) <= 1e-05)) {
                        dVar12 = dVar14 * dVar28 +
                                 dVar15 * dVar28 +
                                 ((((dVar28 * 0.56 + dVar24 * dVar12 + 0.025) - dVar22 * dVar12) -
                                  dVar11) - dVar18);
                        goto joined_r0x0011702e;
                      }
                    }
                  }
                }
              }
            }
            else {
              dVar28 = local_168 + local_108 + local_128 * 0.03605 + -0.265225;
              dVar16 = local_a8[4] * -0.025 +
                       local_178 +
                       local_118 * -0.03605 +
                       dVar16 * -0.0196 +
                       dVar12 * 0.2884 + local_a8[4] * dVar18 + local_a8[4] * dVar24 + 0.018025;
              this->_nj1 = '\x01';
              if (NAN(dVar28) || NAN(dVar16)) {
                bVar3 = false;
                dVar16 = -1.5707963267949;
              }
              else if ((1e-07 <= ABS(dVar28)) || (1e-07 < ABS(dVar16))) {
                dVar16 = atan2(dVar28,dVar16);
                dVar16 = dVar16 + -1.5707963267949;
                bVar3 = true;
              }
              else {
                bVar3 = false;
                dVar16 = -1.5707963267949;
              }
              if (bVar3) {
                dVar12 = this->pz;
                dVar12 = (this->cj2 * 0.000875 +
                         dVar12 * 0.035 * this->sj2 +
                         local_a8[6] +
                         this->cj2 * 0.515 * dVar12 +
                         local_130 +
                         (double)local_188._0_8_ * local_170 + dVar12 * 0.56 + this->sj2 * -0.012875
                         ) - dVar18 * dVar11;
                uVar9 = -(ulong)(0.0 < dVar12);
                dVar12 = (double)(uVar9 & 0x3ff0000000000000 |
                                 ~uVar9 & -(ulong)(dVar12 < 0.0) & 0xbff0000000000000);
                if ((dVar12 != 0.0) || (NAN(dVar12))) {
                  dVar16 = (1.0 / dVar12) * 1.5707963267949 + dVar16;
                  dVar12 = sin(dVar16);
                  local_188._0_8_ = dVar12;
                  dVar12 = cos(dVar16);
                  if (dVar16 <= 3.14159265358979) {
                    if (dVar16 < -3.14159265358979) {
                      dVar16 = dVar16 + 6.28318530717959;
                    }
                  }
                  else {
                    dVar16 = dVar16 + -6.28318530717959;
                  }
                  this->_ij1[0] = '\0';
                  this->_ij1[1] = 0xff;
                  this->j1 = dVar16;
                  this->cj1 = dVar12;
                  this->sj1 = (IkReal)local_188._0_8_;
                  dVar12 = sin(dVar16);
                  dVar28 = cos(this->j1);
                  dVar18 = this->cj0 * this->px;
                  dVar22 = this->py * this->sj0;
                  dVar11 = this->sj2 * 0.515;
                  dVar16 = this->pz;
                  dVar24 = this->cj2 * 0.035;
                  if (ABS((((dVar12 * -0.025 + dVar12 * dVar22 + dVar12 * dVar18) - dVar28 * dVar16)
                          - dVar24) + dVar11) <= 1e-05) {
                    dVar14 = this->cj2 * 0.515;
                    dVar15 = this->sj2 * 0.035;
                    if (((ABS((((dVar28 * 0.025 + (0.56 - dVar18 * dVar28)) - dVar22 * dVar28) +
                               dVar15 + dVar14) - dVar12 * dVar16) <= 1e-05) &&
                        (ABS(dVar12 * 0.56 +
                             ((-dVar28 * dVar24 +
                              dVar28 * dVar11 + dVar12 * dVar15 + dVar12 * dVar14) - dVar16)) <=
                         1e-05)) &&
                       (ABS(dVar22 * 0.05 +
                            dVar18 * 0.05 +
                            dVar16 * 1.12 * dVar12 +
                            ((dVar28 * 1.12 * dVar18 +
                             dVar22 * dVar28 * 1.12 + dVar28 * -0.028 + -0.047775) - this->pp)) <=
                        1e-05)) {
                      dVar12 = (dVar28 * 0.56 +
                               dVar14 * dVar28 +
                               dVar15 * dVar28 + (((dVar24 * dVar12 + 0.025) - dVar18) - dVar22)) -
                               dVar11 * dVar12;
joined_r0x0011702e:
                      if (ABS(dVar12) <= 1e-05) {
                        rotationfunction0(this,solutions);
                      }
                    }
                  }
                }
              }
            }
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 == 1);
      }
    }
    bVar8 = lVar7 == 0;
    lVar7 = lVar7 + 1;
  } while (bVar8);
LAB_0011711c:
  iVar4 = (*solutions->_vptr_IkSolutionListBase[4])(solutions);
  return CONCAT44(extraout_var,iVar4) != 0;
}

Assistant:

bool ComputeIk(const IkReal* eetrans, const IkReal* eerot, const IkReal* pfree, IkSolutionListBase<IkReal>& solutions) {
j0=numeric_limits<IkReal>::quiet_NaN(); _ij0[0] = -1; _ij0[1] = -1; _nj0 = -1; j1=numeric_limits<IkReal>::quiet_NaN(); _ij1[0] = -1; _ij1[1] = -1; _nj1 = -1; j2=numeric_limits<IkReal>::quiet_NaN(); _ij2[0] = -1; _ij2[1] = -1; _nj2 = -1; j3=numeric_limits<IkReal>::quiet_NaN(); _ij3[0] = -1; _ij3[1] = -1; _nj3 = -1; j4=numeric_limits<IkReal>::quiet_NaN(); _ij4[0] = -1; _ij4[1] = -1; _nj4 = -1; j5=numeric_limits<IkReal>::quiet_NaN(); _ij5[0] = -1; _ij5[1] = -1; _nj5 = -1; 
for(int dummyiter = 0; dummyiter < 1; ++dummyiter) {
    solutions.Clear();
r00 = eerot[0*3+0];
r01 = eerot[0*3+1];
r02 = eerot[0*3+2];
r10 = eerot[1*3+0];
r11 = eerot[1*3+1];
r12 = eerot[1*3+2];
r20 = eerot[2*3+0];
r21 = eerot[2*3+1];
r22 = eerot[2*3+2];
px = eetrans[0]; py = eetrans[1]; pz = eetrans[2];

new_r00=r02;
new_r01=r01;
new_r02=((-1.0)*r00);
new_px=((((-0.08)*r00))+px);
new_r10=((-1.0)*r12);
new_r11=((-1.0)*r11);
new_r12=r10;
new_py=((((-1.0)*py))+(((0.08)*r10)));
new_r20=((-1.0)*r22);
new_r21=((-1.0)*r21);
new_r22=r20;
new_pz=((0.4)+(((-1.0)*pz))+(((0.08)*r20)));
r00 = new_r00; r01 = new_r01; r02 = new_r02; r10 = new_r10; r11 = new_r11; r12 = new_r12; r20 = new_r20; r21 = new_r21; r22 = new_r22; px = new_px; py = new_py; pz = new_pz;
IkReal x54=((1.0)*px);
IkReal x55=((1.0)*pz);
IkReal x56=((1.0)*py);
pp=((px*px)+(py*py)+(pz*pz));
npx=(((px*r00))+((py*r10))+((pz*r20)));
npy=(((px*r01))+((py*r11))+((pz*r21)));
npz=(((px*r02))+((py*r12))+((pz*r22)));
rxp0_0=((((-1.0)*r20*x56))+((pz*r10)));
rxp0_1=(((px*r20))+(((-1.0)*r00*x55)));
rxp0_2=((((-1.0)*r10*x54))+((py*r00)));
rxp1_0=((((-1.0)*r21*x56))+((pz*r11)));
rxp1_1=(((px*r21))+(((-1.0)*r01*x55)));
rxp1_2=((((-1.0)*r11*x54))+((py*r01)));
rxp2_0=(((pz*r12))+(((-1.0)*r22*x56)));
rxp2_1=(((px*r22))+(((-1.0)*r02*x55)));
rxp2_2=((((-1.0)*r12*x54))+((py*r02)));
{
IkReal j0eval[1];
j0eval[0]=((IKabs(px))+(IKabs(py)));
if( IKabs(j0eval[0]) < 0.0000010000000000  )
{
continue; // no branches [j0, j1, j2]

} else
{
{
IkReal j0array[2], cj0array[2], sj0array[2];
bool j0valid[2]={false};
_nj0 = 2;
CheckValue<IkReal> x58 = IKatan2WithCheck(IkReal(py),IkReal(((-1.0)*px)),IKFAST_ATAN2_MAGTHRESH);
if(!x58.valid){
continue;
}
IkReal x57=x58.value;
j0array[0]=((-1.0)*x57);
sj0array[0]=IKsin(j0array[0]);
cj0array[0]=IKcos(j0array[0]);
j0array[1]=((3.14159265358979)+(((-1.0)*x57)));
sj0array[1]=IKsin(j0array[1]);
cj0array[1]=IKcos(j0array[1]);
if( j0array[0] > IKPI )
{
    j0array[0]-=IK2PI;
}
else if( j0array[0] < -IKPI )
{    j0array[0]+=IK2PI;
}
j0valid[0] = true;
if( j0array[1] > IKPI )
{
    j0array[1]-=IK2PI;
}
else if( j0array[1] < -IKPI )
{    j0array[1]+=IK2PI;
}
j0valid[1] = true;
for(int ij0 = 0; ij0 < 2; ++ij0)
{
if( !j0valid[ij0] )
{
    continue;
}
_ij0[0] = ij0; _ij0[1] = -1;
for(int iij0 = ij0+1; iij0 < 2; ++iij0)
{
if( j0valid[iij0] && IKabs(cj0array[ij0]-cj0array[iij0]) < IKFAST_SOLUTION_THRESH && IKabs(sj0array[ij0]-sj0array[iij0]) < IKFAST_SOLUTION_THRESH )
{
    j0valid[iij0]=false; _ij0[1] = iij0; break; 
}
}
j0 = j0array[ij0]; cj0 = cj0array[ij0]; sj0 = sj0array[ij0];

{
IkReal j2array[2], cj2array[2], sj2array[2];
bool j2valid[2]={false};
_nj2 = 2;
if( (((1.00223910638213)+(((-1.72971326121954)*pp))+(((0.0864856630609769)*py*sj0))+(((0.0864856630609769)*cj0*px)))) < -1-IKFAST_SINCOS_THRESH || (((1.00223910638213)+(((-1.72971326121954)*pp))+(((0.0864856630609769)*py*sj0))+(((0.0864856630609769)*cj0*px)))) > 1+IKFAST_SINCOS_THRESH )
    continue;
IkReal x59=IKasin(((1.00223910638213)+(((-1.72971326121954)*pp))+(((0.0864856630609769)*py*sj0))+(((0.0864856630609769)*cj0*px))));
j2array[0]=((-1.50293950393859)+(((-1.0)*x59)));
sj2array[0]=IKsin(j2array[0]);
cj2array[0]=IKcos(j2array[0]);
j2array[1]=((1.6386531496512)+x59);
sj2array[1]=IKsin(j2array[1]);
cj2array[1]=IKcos(j2array[1]);
if( j2array[0] > IKPI )
{
    j2array[0]-=IK2PI;
}
else if( j2array[0] < -IKPI )
{    j2array[0]+=IK2PI;
}
j2valid[0] = true;
if( j2array[1] > IKPI )
{
    j2array[1]-=IK2PI;
}
else if( j2array[1] < -IKPI )
{    j2array[1]+=IK2PI;
}
j2valid[1] = true;
for(int ij2 = 0; ij2 < 2; ++ij2)
{
if( !j2valid[ij2] )
{
    continue;
}
_ij2[0] = ij2; _ij2[1] = -1;
for(int iij2 = ij2+1; iij2 < 2; ++iij2)
{
if( j2valid[iij2] && IKabs(cj2array[ij2]-cj2array[iij2]) < IKFAST_SOLUTION_THRESH && IKabs(sj2array[ij2]-sj2array[iij2]) < IKFAST_SOLUTION_THRESH )
{
    j2valid[iij2]=false; _ij2[1] = iij2; break; 
}
}
j2 = j2array[ij2]; cj2 = cj2array[ij2]; sj2 = sj2array[ij2];

{
IkReal j1eval[3];
IkReal x60=cj2*cj2;
IkReal x61=(cj0*px);
IkReal x62=(cj2*sj2);
IkReal x63=((0.515)*sj2);
IkReal x64=(py*sj0);
IkReal x65=((40.0)*cj2);
IkReal x66=((0.035)*cj2);
IkReal x67=((588.571428571429)*sj2);
IkReal x68=(cj2*pz);
IkReal x69=(pz*sj2);
j1eval[0]=((((-1.0)*x61*x65))+(((640.0)*pz))+cj2+((x61*x67))+(((-14.7142857142857)*sj2))+(((588.571428571429)*x68))+(((-1.0)*x64*x65))+((x64*x67))+(((40.0)*x69)));
j1eval[1]=IKsign(((((-1.0)*x61*x66))+(((0.56)*pz))+(((-0.012875)*sj2))+(((0.035)*x69))+(((0.515)*x68))+((x61*x63))+(((-1.0)*x64*x66))+((x63*x64))+(((0.000875)*cj2))));
j1eval[2]=((IKabs(((-0.265225)+(pz*pz)+(((0.264)*x60))+(((0.03605)*x62)))))+(IKabs(((0.018025)+(((0.2884)*sj2))+(((-0.03605)*x60))+(((-0.0196)*cj2))+(((0.264)*x62))+((pz*x64))+((pz*x61))+(((-0.025)*pz))))));
if( IKabs(j1eval[0]) < 0.0000010000000000  || IKabs(j1eval[1]) < 0.0000010000000000  || IKabs(j1eval[2]) < 0.0000010000000000  )
{
{
IkReal j1eval[2];
IkReal x70=(py*sj0);
IkReal x71=((40.0)*sj2);
IkReal x72=(cj0*px);
IkReal x73=(cj2*pz);
IkReal x74=((0.035)*sj2);
IkReal x75=(pz*sj2);
IkReal x76=((588.571428571429)*cj2);
IkReal x77=((0.515)*cj2);
j1eval[0]=((16.0)+sj2+(((-1.0)*x70*x76))+(((-1.0)*x70*x71))+(((14.7142857142857)*cj2))+(((-40.0)*x73))+(((-1.0)*x71*x72))+(((-640.0)*x70))+(((-640.0)*x72))+(((588.571428571429)*x75))+(((-1.0)*x72*x76)));
j1eval[1]=IKsign(((0.014)+(((0.515)*x75))+(((-1.0)*x70*x77))+(((-1.0)*x70*x74))+(((-0.56)*x72))+(((-0.56)*x70))+(((0.012875)*cj2))+(((-0.035)*x73))+(((0.000875)*sj2))+(((-1.0)*x72*x74))+(((-1.0)*x72*x77))));
if( IKabs(j1eval[0]) < 0.0000010000000000  || IKabs(j1eval[1]) < 0.0000010000000000  )
{
{
IkReal j1eval[2];
IkReal x78=cj0*cj0;
IkReal x79=py*py;
IkReal x80=px*px;
IkReal x81=pz*pz;
IkReal x82=(cj0*px);
IkReal x83=(py*sj0);
IkReal x84=((1600.0)*x79);
IkReal x85=(x78*x80);
j1eval[0]=((-1.0)+((x78*x84))+(((-3200.0)*x82*x83))+(((80.0)*x83))+(((80.0)*x82))+(((-1600.0)*x85))+(((-1600.0)*x81))+(((-1.0)*x84)));
j1eval[1]=IKsign(((-0.000625)+(((0.05)*x83))+(((0.05)*x82))+(((-2.0)*x82*x83))+((x78*x79))+(((-1.0)*x81))+(((-1.0)*x85))+(((-1.0)*x79))));
if( IKabs(j1eval[0]) < 0.0000010000000000  || IKabs(j1eval[1]) < 0.0000010000000000  )
{
continue; // no branches [j1]

} else
{
{
IkReal j1array[1], cj1array[1], sj1array[1];
bool j1valid[1]={false};
_nj1 = 1;
IkReal x86=py*py;
IkReal x87=cj0*cj0;
IkReal x88=(cj0*px);
IkReal x89=((0.515)*sj2);
IkReal x90=(py*sj0);
IkReal x91=((0.035)*cj2);
IkReal x92=((0.035)*sj2);
IkReal x93=((0.515)*cj2);
IkReal x94=(sj2*x90);
CheckValue<IkReal> x95 = IKatan2WithCheck(IkReal(((((-1.0)*pz*x92))+(((-1.0)*pz*x93))+(((-0.012875)*sj2))+((x89*x90))+(((-0.56)*pz))+(((-1.0)*x90*x91))+((x88*x89))+(((-1.0)*x88*x91))+(((0.000875)*cj2)))),IkReal(((0.014)+(((-1.0)*x90*x93))+(((-1.0)*x90*x92))+(((0.012875)*cj2))+((pz*x91))+(((0.000875)*sj2))+(((-1.0)*x88*x92))+(((-1.0)*x88*x93))+(((-0.56)*x90))+(((-0.56)*x88))+(((-1.0)*pz*x89)))),IKFAST_ATAN2_MAGTHRESH);
if(!x95.valid){
continue;
}
CheckValue<IkReal> x96=IKPowWithIntegerCheck(IKsign(((-0.000625)+(((0.05)*x88))+(((0.05)*x90))+((x86*x87))+(((-2.0)*x88*x90))+(((-1.0)*x86))+(((-1.0)*(pz*pz)))+(((-1.0)*x87*(px*px))))),-1);
if(!x96.valid){
continue;
}
j1array[0]=((-1.5707963267949)+(x95.value)+(((1.5707963267949)*(x96.value))));
sj1array[0]=IKsin(j1array[0]);
cj1array[0]=IKcos(j1array[0]);
if( j1array[0] > IKPI )
{
    j1array[0]-=IK2PI;
}
else if( j1array[0] < -IKPI )
{    j1array[0]+=IK2PI;
}
j1valid[0] = true;
for(int ij1 = 0; ij1 < 1; ++ij1)
{
if( !j1valid[ij1] )
{
    continue;
}
_ij1[0] = ij1; _ij1[1] = -1;
for(int iij1 = ij1+1; iij1 < 1; ++iij1)
{
if( j1valid[iij1] && IKabs(cj1array[ij1]-cj1array[iij1]) < IKFAST_SOLUTION_THRESH && IKabs(sj1array[ij1]-sj1array[iij1]) < IKFAST_SOLUTION_THRESH )
{
    j1valid[iij1]=false; _ij1[1] = iij1; break; 
}
}
j1 = j1array[ij1]; cj1 = cj1array[ij1]; sj1 = sj1array[ij1];
{
IkReal evalcond[5];
IkReal x97=IKsin(j1);
IkReal x98=IKcos(j1);
IkReal x99=((0.515)*cj2);
IkReal x100=(cj0*px);
IkReal x101=((0.515)*sj2);
IkReal x102=((0.035)*sj2);
IkReal x103=(py*sj0);
IkReal x104=((1.0)*pz);
IkReal x105=((0.035)*cj2);
IkReal x106=((1.0)*x98);
IkReal x107=((1.12)*x98);
evalcond[0]=(((x100*x97))+((x103*x97))+(((-1.0)*x105))+x101+(((-0.025)*x97))+(((-1.0)*x104*x98)));
evalcond[1]=((0.56)+(((-1.0)*x100*x106))+(((0.025)*x98))+x102+x99+(((-1.0)*x103*x106))+(((-1.0)*x104*x97)));
evalcond[2]=(((x102*x97))+((x101*x98))+(((-1.0)*x104))+((x97*x99))+(((-1.0)*x105*x98))+(((0.56)*x97)));
evalcond[3]=((-0.047775)+((x103*x107))+(((-1.0)*pp))+(((-0.028)*x98))+(((1.12)*pz*x97))+(((0.05)*x103))+(((0.05)*x100))+((x100*x107)));
evalcond[4]=((0.025)+((x102*x98))+(((0.56)*x98))+(((-1.0)*x101*x97))+((x98*x99))+((x105*x97))+(((-1.0)*x103))+(((-1.0)*x100)));
if( IKabs(evalcond[0]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[1]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[2]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[3]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[4]) > IKFAST_EVALCOND_THRESH  )
{
continue;
}
}

rotationfunction0(solutions);
}
}

}

}

} else
{
{
IkReal j1array[1], cj1array[1], sj1array[1];
bool j1valid[1]={false};
_nj1 = 1;
IkReal x610=cj2*cj2;
IkReal x611=(cj2*sj2);
IkReal x612=(py*sj0);
IkReal x613=((0.035)*sj2);
IkReal x614=(cj0*px);
IkReal x615=((1.0)*pz);
IkReal x616=((0.515)*cj2);
CheckValue<IkReal> x617 = IKatan2WithCheck(IkReal(((0.018025)+(((-1.0)*x612*x615))+(((0.025)*pz))+(((-1.0)*x614*x615))+(((0.2884)*sj2))+(((-0.03605)*x610))+(((0.264)*x611))+(((-0.0196)*cj2)))),IkReal(((-0.314825)+(((-0.03605)*x611))+(((-0.264)*x610))+(pz*pz)+(((-0.5768)*cj2))+(((-0.0392)*sj2)))),IKFAST_ATAN2_MAGTHRESH);
if(!x617.valid){
continue;
}
CheckValue<IkReal> x618=IKPowWithIntegerCheck(IKsign(((0.014)+(((-1.0)*x612*x616))+(((-1.0)*x612*x613))+(((-1.0)*x614*x616))+(((-0.035)*cj2*pz))+(((0.515)*pz*sj2))+(((0.012875)*cj2))+(((-1.0)*x613*x614))+(((0.000875)*sj2))+(((-0.56)*x614))+(((-0.56)*x612)))),-1);
if(!x618.valid){
continue;
}
j1array[0]=((-1.5707963267949)+(x617.value)+(((1.5707963267949)*(x618.value))));
sj1array[0]=IKsin(j1array[0]);
cj1array[0]=IKcos(j1array[0]);
if( j1array[0] > IKPI )
{
    j1array[0]-=IK2PI;
}
else if( j1array[0] < -IKPI )
{    j1array[0]+=IK2PI;
}
j1valid[0] = true;
for(int ij1 = 0; ij1 < 1; ++ij1)
{
if( !j1valid[ij1] )
{
    continue;
}
_ij1[0] = ij1; _ij1[1] = -1;
for(int iij1 = ij1+1; iij1 < 1; ++iij1)
{
if( j1valid[iij1] && IKabs(cj1array[ij1]-cj1array[iij1]) < IKFAST_SOLUTION_THRESH && IKabs(sj1array[ij1]-sj1array[iij1]) < IKFAST_SOLUTION_THRESH )
{
    j1valid[iij1]=false; _ij1[1] = iij1; break; 
}
}
j1 = j1array[ij1]; cj1 = cj1array[ij1]; sj1 = sj1array[ij1];
{
IkReal evalcond[5];
IkReal x619=IKsin(j1);
IkReal x620=IKcos(j1);
IkReal x621=((0.515)*cj2);
IkReal x622=(cj0*px);
IkReal x623=((0.515)*sj2);
IkReal x624=((0.035)*sj2);
IkReal x625=(py*sj0);
IkReal x626=((1.0)*pz);
IkReal x627=((0.035)*cj2);
IkReal x628=((1.0)*x620);
IkReal x629=((1.12)*x620);
evalcond[0]=(((x619*x625))+((x619*x622))+(((-1.0)*x627))+(((-1.0)*x620*x626))+(((-0.025)*x619))+x623);
evalcond[1]=((0.56)+(((-1.0)*x622*x628))+(((0.025)*x620))+(((-1.0)*x625*x628))+x624+x621+(((-1.0)*x619*x626)));
evalcond[2]=((((0.56)*x619))+((x619*x624))+((x619*x621))+(((-1.0)*x626))+(((-1.0)*x620*x627))+((x620*x623)));
evalcond[3]=((-0.047775)+(((0.05)*x625))+(((0.05)*x622))+(((-0.028)*x620))+(((1.12)*pz*x619))+((x625*x629))+(((-1.0)*pp))+((x622*x629)));
evalcond[4]=((0.025)+((x619*x627))+(((0.56)*x620))+(((-1.0)*x619*x623))+(((-1.0)*x622))+(((-1.0)*x625))+((x620*x621))+((x620*x624)));
if( IKabs(evalcond[0]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[1]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[2]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[3]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[4]) > IKFAST_EVALCOND_THRESH  )
{
continue;
}
}

rotationfunction0(solutions);
}
}

}

}

} else
{
{
IkReal j1array[1], cj1array[1], sj1array[1];
bool j1valid[1]={false};
_nj1 = 1;
IkReal x630=cj2*cj2;
IkReal x631=(cj0*px);
IkReal x632=((0.035)*cj2);
IkReal x633=(cj2*sj2);
IkReal x634=((0.515)*sj2);
IkReal x635=(py*sj0);
CheckValue<IkReal> x636 = IKatan2WithCheck(IkReal(((-0.265225)+(((0.03605)*x633))+(pz*pz)+(((0.264)*x630)))),IkReal(((0.018025)+((pz*x631))+((pz*x635))+(((0.2884)*sj2))+(((-0.0196)*cj2))+(((-0.03605)*x630))+(((0.264)*x633))+(((-0.025)*pz)))),IKFAST_ATAN2_MAGTHRESH);
if(!x636.valid){
continue;
}
CheckValue<IkReal> x637=IKPowWithIntegerCheck(IKsign(((((0.56)*pz))+(((-0.012875)*sj2))+(((-1.0)*x631*x632))+((x634*x635))+(((0.515)*cj2*pz))+((x631*x634))+(((0.035)*pz*sj2))+(((0.000875)*cj2))+(((-1.0)*x632*x635)))),-1);
if(!x637.valid){
continue;
}
j1array[0]=((-1.5707963267949)+(x636.value)+(((1.5707963267949)*(x637.value))));
sj1array[0]=IKsin(j1array[0]);
cj1array[0]=IKcos(j1array[0]);
if( j1array[0] > IKPI )
{
    j1array[0]-=IK2PI;
}
else if( j1array[0] < -IKPI )
{    j1array[0]+=IK2PI;
}
j1valid[0] = true;
for(int ij1 = 0; ij1 < 1; ++ij1)
{
if( !j1valid[ij1] )
{
    continue;
}
_ij1[0] = ij1; _ij1[1] = -1;
for(int iij1 = ij1+1; iij1 < 1; ++iij1)
{
if( j1valid[iij1] && IKabs(cj1array[ij1]-cj1array[iij1]) < IKFAST_SOLUTION_THRESH && IKabs(sj1array[ij1]-sj1array[iij1]) < IKFAST_SOLUTION_THRESH )
{
    j1valid[iij1]=false; _ij1[1] = iij1; break; 
}
}
j1 = j1array[ij1]; cj1 = cj1array[ij1]; sj1 = sj1array[ij1];
{
IkReal evalcond[5];
IkReal x638=IKsin(j1);
IkReal x639=IKcos(j1);
IkReal x640=((0.515)*cj2);
IkReal x641=(cj0*px);
IkReal x642=((0.515)*sj2);
IkReal x643=((0.035)*sj2);
IkReal x644=(py*sj0);
IkReal x645=((1.0)*pz);
IkReal x646=((0.035)*cj2);
IkReal x647=((1.0)*x639);
IkReal x648=((1.12)*x639);
evalcond[0]=(((x638*x644))+((x638*x641))+(((-0.025)*x638))+(((-1.0)*x639*x645))+(((-1.0)*x646))+x642);
evalcond[1]=((0.56)+(((-1.0)*x641*x647))+(((0.025)*x639))+(((-1.0)*x644*x647))+x643+x640+(((-1.0)*x638*x645)));
evalcond[2]=(((x638*x643))+((x638*x640))+((x639*x642))+(((-1.0)*x639*x646))+(((-1.0)*x645))+(((0.56)*x638)));
evalcond[3]=((-0.047775)+(((-0.028)*x639))+((x644*x648))+((x641*x648))+(((-1.0)*pp))+(((1.12)*pz*x638))+(((0.05)*x641))+(((0.05)*x644)));
evalcond[4]=((0.025)+((x638*x646))+(((-1.0)*x641))+(((-1.0)*x644))+((x639*x643))+((x639*x640))+(((0.56)*x639))+(((-1.0)*x638*x642)));
if( IKabs(evalcond[0]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[1]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[2]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[3]) > IKFAST_EVALCOND_THRESH  || IKabs(evalcond[4]) > IKFAST_EVALCOND_THRESH  )
{
continue;
}
}

rotationfunction0(solutions);
}
}

}

}
}
}
}
}

}

}
}
return solutions.GetNumSolutions()>0;
}